

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dirscanner_unix.cpp
# Opt level: O0

void __thiscall trun::DirScanner::CheckAddFile(DirScanner *this,string *filename)

{
  bool bVar1;
  char *pcVar2;
  allocator<char> local_71;
  value_type local_70;
  char *local_50;
  char *fullPath;
  undefined1 local_38 [8];
  string ext;
  string *filename_local;
  DirScanner *this_local;
  
  ext.field_2._8_8_ = filename;
  GetExtension((string *)local_38,this,filename);
  bVar1 = IsExtensionOk(this,(string *)local_38);
  if (bVar1) {
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ext.field_2._8_8_);
    pcVar2 = realpath(pcVar2,(char *)0x0);
    local_50 = pcVar2;
    if (pcVar2 != (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,pcVar2,&local_71);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->filenames,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::allocator<char>::~allocator(&local_71);
    }
  }
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void DirScanner::CheckAddFile(std::string &filename) {
    std::string ext = GetExtension(filename);
    if (IsExtensionOk(ext)) {
        // Need proper path to file
        char *fullPath = realpath(filename.c_str(),NULL);
        if (fullPath != nullptr) {
            filenames.push_back(std::string(fullPath));
        }
    }
}